

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O1

void __thiscall google::protobuf::internal::MapFieldBase::~MapFieldBase(MapFieldBase *this)

{
  TaggedPtr p;
  Arena *v1;
  ReflectionPayload *this_00;
  Nonnull<const_char_*> failure_msg;
  LogMessageFatal LStack_18;
  
  v1 = arena(this);
  if (v1 == (Arena *)0x0) {
    failure_msg = (Nonnull<const_char_*>)0x0;
  }
  else {
    failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                            (v1,(void *)0x0,"arena() == nullptr");
  }
  if (failure_msg != (Nonnull<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&LStack_18,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_field.cc"
               ,0x22,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
  }
  p = (this->super_MapFieldBaseForParse).payload_._M_i;
  if ((p & 1) == 0) {
    this_00 = (ReflectionPayload *)0x0;
  }
  else {
    this_00 = ToPayload(p);
  }
  if (this_00 != (ReflectionPayload *)0x0) {
    absl::lts_20250127::Mutex::Dtor(&this_00->mutex);
    RepeatedPtrField<google::protobuf::Message>::~RepeatedPtrField(&this_00->repeated_field);
    operator_delete(this_00,0x28);
    return;
  }
  return;
}

Assistant:

MapFieldBase::~MapFieldBase() {
  ABSL_DCHECK_EQ(arena(), nullptr);
  delete maybe_payload();
}